

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O1

void CF_MEMTRACE_FREE(void *p,cf_char_t *file,cf_char_t *function,int line)

{
  undefined8 *__ptr;
  void *local_10;
  
  if (g_memchk_ctx.inited != 0) {
    local_10 = p;
    cf_mutex_lock(&g_memchk_ctx.mutex);
    __ptr = (undefined8 *)cf_hashtbl_get(g_memchk_ctx.alloc_info,&local_10,8);
    if (__ptr == (undefined8 *)0x0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/src/cf/memory.c"
                    ,0x7a,"void CF_MEMTRACE_FREE(void *, const cf_char_t *, const cf_char_t *, int)"
                   );
    }
    if (g_memchk_ctx.alloc_size < (ulong)__ptr[3]) {
      __assert_fail("g_memchk_ctx.alloc_size >= info->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/src/cf/memory.c"
                    ,0x70,"void CF_MEMTRACE_FREE(void *, const cf_char_t *, const cf_char_t *, int)"
                   );
    }
    g_memchk_ctx.alloc_size = g_memchk_ctx.alloc_size - __ptr[3];
    free((void *)*__ptr);
    free((void *)__ptr[1]);
    free(__ptr);
    cf_hashtbl_set(g_memchk_ctx.alloc_info,&local_10,8,(cf_void_t *)0x0);
    cf_mutex_unlock(&g_memchk_ctx.mutex);
  }
  return;
}

Assistant:

void CF_MEMTRACE_FREE(void* p,
                      const cf_char_t* file,
                      const cf_char_t* function,
                      int line) {
    malloc_info* info;
    if (!g_memchk_ctx.inited) return;

    /* printf("free: %p, file: %s, func: %s, line: %d\n", p, file, function, line); */
    cf_mutex_lock(&g_memchk_ctx.mutex);

    info = CF_TYPE_CAST(malloc_info*, cf_hashtbl_get(g_memchk_ctx.alloc_info, &p, sizeof(void*)));
    if (info) {
        cf_assert(g_memchk_ctx.alloc_size >= info->size);
        g_memchk_ctx.alloc_size -= info->size;

        {
            cf_free_native((void*)info->location.file_name);
            cf_free_native((void*)info->location.function_name);
            cf_free_native(info);
        }
        cf_hashtbl_set(g_memchk_ctx.alloc_info, &p, sizeof(void*), CF_NULL_PTR);
    } else {
        cf_assert(CF_FALSE);
    }

    cf_mutex_unlock(&g_memchk_ctx.mutex);
}